

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

char * strpool_collate(strpool_t *pool,int *count)

{
  int iVar1;
  char *__src;
  char *src;
  int len;
  int i_1;
  char *ptr;
  char *strings;
  int i;
  int size;
  int *count_local;
  strpool_t *pool_local;
  
  strings._4_4_ = 0;
  for (strings._0_4_ = 0; (int)strings < pool->entry_count; strings._0_4_ = (int)strings + 1) {
    strings._4_4_ = pool->entries[(int)strings].length + 1 + strings._4_4_;
  }
  if (strings._4_4_ == 0) {
    pool_local = (strpool_t *)0x0;
  }
  else {
    pool_local = (strpool_t *)
                 sx__malloc((sx_alloc *)pool->memctx,(long)strings._4_4_,0,(char *)0x0,(char *)0x0,0
                           );
    if (pool_local == (strpool_t *)0x0) {
      __assert_fail("strings",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x4b9,"char *strpool_collate(const strpool_t *, int *)");
    }
    *count = pool->entry_count;
    _len = pool_local;
    for (src._4_4_ = 0; src._4_4_ < pool->entry_count; src._4_4_ = src._4_4_ + 1) {
      iVar1 = pool->entries[src._4_4_].length + 1;
      __src = pool->entries[src._4_4_].data + 8;
      pool->entries[src._4_4_].data = __src;
      memcpy(_len,__src,(long)iVar1);
      _len = (strpool_t *)((long)&_len->memctx + (long)iVar1);
    }
  }
  return (char *)pool_local;
}

Assistant:

char* strpool_collate( strpool_t const* pool, int* count )
    {
    int size = 0;
    for( int i = 0; i < pool->entry_count; ++i ) size += pool->entries[ i ].length + 1;
    if( size == 0 ) return NULL;

    char* strings = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) size );
    STRPOOL_ASSERT( strings );
    *count = pool->entry_count;
    char* ptr = strings;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        int len = pool->entries[ i ].length + 1;
        char* src = pool->entries[ i ].data += 2 * sizeof( STRPOOL_U32 );
        STRPOOL_MEMCPY( ptr, src, (size_t) len );
        ptr += len;
        }
    return strings;
    }